

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O1

void drop_message(skynet_message *msg,void *ud)

{
  free(msg->data);
  if (*ud != 0) {
    skynet_send((skynet_context *)0x0,*ud,msg->source,7,0,(void *)0x0,0);
    return;
  }
  __assert_fail("source",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_server.c"
                ,0x72,"void drop_message(struct skynet_message *, void *)");
}

Assistant:

static void
drop_message(struct skynet_message *msg, void *ud) {
	struct drop_t *d = ud;
	skynet_free(msg->data);
	uint32_t source = d->handle;
	assert(source);
	// report error to the message source
	skynet_send(NULL, source, msg->source, PTYPE_ERROR, 0, NULL, 0);
}